

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_auxv.c
# Opt level: O2

link_map * get_vdso_from_maps(void)

{
  link_map *plVar1;
  int __fd;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  long lVar5;
  int *piVar6;
  code *pcVar7;
  long lVar8;
  char *pcVar9;
  Elf64_Addr addr_end;
  Elf64_Addr addr_begin;
  char line [4096];
  char name [4096];
  
  addr_begin = 0;
  addr_end = 0;
  lVar8 = 0;
  memset(name,0,0x1000);
  memset(line,0,0x1000);
  __fd = open("/proc/self/maps",0);
  do {
    while (pcVar9 = line + 0xfff, lVar8 == 0xfff) {
LAB_0022ef12:
      *pcVar9 = '\0';
      iVar2 = read_hex(line,&addr_begin);
      lVar5 = (long)iVar2;
      lVar8 = 0;
      if (line[lVar5] == '-') {
        iVar2 = read_hex(line + lVar5 + 1,&addr_end);
        pcVar9 = line + iVar2 + lVar5 + 1;
        iVar2 = read_word(pcVar9,(char *)0x0,0);
        pcVar9 = pcVar9 + iVar2;
        iVar2 = read_word(pcVar9,(char *)0x0,0);
        pcVar9 = pcVar9 + iVar2;
        iVar2 = read_word(pcVar9,(char *)0x0,0);
        iVar3 = read_word(pcVar9 + iVar2,(char *)0x0,0);
        read_word(pcVar9 + iVar2 + iVar3,name,0x1000);
        iVar2 = bcmp(name,"[vdso]",7);
        lVar8 = 0;
        if (iVar2 == 0) {
          close(__fd);
          pcVar7 = std::__throw_regex_error;
          while( true ) {
            plVar1 = *(link_map **)pcVar7;
            if (plVar1 == (link_map *)0x0) {
              return (link_map *)0x0;
            }
            if ((addr_begin <= plVar1->l_ld) && (plVar1->l_ld < addr_end)) break;
            pcVar7 = (code *)&plVar1->l_next;
          }
          return plVar1;
        }
      }
    }
    pcVar9 = line + lVar8;
    sVar4 = read(__fd,pcVar9,1);
    if ((int)sVar4 == -1) {
      piVar6 = __errno_location();
      if (*piVar6 != 4) goto LAB_0022efde;
    }
    else {
      if ((int)sVar4 == 0) {
LAB_0022efde:
        *pcVar9 = '\0';
        close(__fd);
        return (link_map *)0x0;
      }
      if (*pcVar9 == '\n') {
        pcVar9 = line + lVar8 + 1;
        goto LAB_0022ef12;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

struct link_map *get_vdso_from_maps() {
  int maps = 0, hit_eof = 0;
  ElfW(Addr) addr_begin = 0, addr_end = 0, dynamic = 0;
  char name[BUFFER_LEN] = {'\0'}, line[BUFFER_LEN] = {'\0'}, *line_pos = NULL;
  struct link_map *m = NULL;
  maps = gotcha_open("/proc/self/maps", O_RDONLY);
  for (;;) {
    hit_eof = read_line(line, BUFFER_LEN, maps);
    if (hit_eof) {
      gotcha_close(maps);  // GCOVR_EXCL_LINE
      return NULL;         // GCOVR_EXCL_LINE
    }
    line_pos = line;
    line_pos += read_hex(line_pos, &addr_begin);
    if (*line_pos != '-') continue;  // GCOVR_EXCL_LINE
    line_pos++;
    line_pos += read_hex(line_pos, &addr_end);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, NULL, 0);
    line_pos += read_word(line_pos, name, sizeof(name));
    if (gotcha_strcmp(name, "[vdso]") == 0) {
      gotcha_close(maps);
      break;
    }
  }

  for (m = _r_debug.r_map; m; m = m->l_next) {
    dynamic = (ElfW(Addr))m->l_ld;
    if (dynamic >= addr_begin && dynamic < addr_end) return m;
  }

  return NULL;  // GCOVR_EXCL_LINE
}